

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_24::AggregateErrorCollector::RecordError
          (AggregateErrorCollector *this,int param_1,int param_2,string_view message)

{
  AlphaNum local_48;
  
  if ((this->error_)._M_string_length != 0) {
    local_48.piece_ = absl::lts_20250127::NullSafeStringView("; ");
    absl::lts_20250127::StrAppend(&this->error_,&local_48);
  }
  local_48.piece_ = message;
  absl::lts_20250127::StrAppend(&this->error_,&local_48);
  return;
}

Assistant:

void RecordError(int /* line */, int /* column */,
                   const absl::string_view message) override {
    if (!error_.empty()) {
      absl::StrAppend(&error_, "; ");
    }
    absl::StrAppend(&error_, message);
  }